

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_exception.h
# Opt level: O1

void __thiscall LumaException::LumaException(LumaException *this,char *message)

{
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  *(undefined ***)this = &PTR__LumaException_0010ccd0;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,message,&local_41);
  std::__cxx11::string::operator=((string *)&this->msg,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

LumaException( const char *message )
  {
    msg = std::string( message );
  }